

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.h
# Opt level: O0

bool __thiscall
llvm::cl::
OptionValueCopy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
compare(OptionValueCopy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *V)

{
  bool local_19;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *V_local;
  OptionValueCopy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  local_19 = false;
  if ((this->Valid & 1U) != 0) {
    local_19 = std::operator!=(&this->Value,V);
  }
  return local_19;
}

Assistant:

bool compare(const DataType &V) const { return Valid && (Value != V); }